

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar1;
  cmGeneratorTarget *target_00;
  element_type *this_00;
  cmTarget *__p;
  bool bVar2;
  cmValue cVar3;
  cmMakefile *mf;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  parentDagChecker;
  cmTarget dummyHead;
  cmGeneratorTarget *target;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  cmGeneratorTarget *local_a08;
  cmGeneratorExpression local_a00;
  cmTarget local_9f0;
  cmGeneratorTarget *local_9e8;
  string *local_9e0;
  undefined1 local_9d8 [40];
  string local_9b0 [32];
  string local_990;
  cmGeneratorExpressionDAGChecker local_970;
  cmGeneratorTarget local_8f0;
  
  local_a08 = tgt;
  cVar3 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (cVar3.Value == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_9d8._16_8_ = 0;
    local_9d8._24_8_ = 0;
    local_9e0 = language;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_9d8 + 0x10));
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_9d8,(cmListFileBacktrace *)(local_9d8 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_9d8 + 0x18));
    local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar2 = std::operator==(propName,"INTERFACE_LINK_OPTIONS");
    if (bVar2) {
      local_970.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
      local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::
      make_unique<cmGeneratorExpressionDAGChecker,cmGeneratorTarget_const*&,char_const(&)[13],decltype(nullptr),decltype(nullptr)>
                ((cmGeneratorTarget **)&local_8f0,(char (*) [13])&local_a08,(void **)0x595c3f,
                 &local_970.Parent);
      __p = local_8f0.Target;
      local_8f0.Target = (cmTarget *)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
               *)&local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(pointer)__p);
      std::
      unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
                     *)&local_8f0);
    }
    target_00 = local_a08;
    std::__cxx11::string::string((string *)&local_990,(string *)propName);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_970,target_00,&local_990,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)
               local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::string(local_9b0,(string *)cVar3.Value);
    psVar5 = local_9e0;
    cmGeneratorExpression::Parse(&local_a00,(string *)local_9d8);
    std::__cxx11::string::~string(local_9b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"try_compile_dummy_exe",(allocator<char> *)&local_9e8);
    mf = cmTarget::GetMakefile(local_a08->Target);
    cmTarget::cmTarget(&local_9f0,(string *)&local_8f0,EXECUTABLE,VisibilityNormal,mf,Yes);
    std::__cxx11::string::~string((string *)&local_8f0);
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(local_a08);
    cmGeneratorTarget::cmGeneratorTarget(&local_8f0,&local_9f0,pcVar4);
    this_00 = local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(local_a08);
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)this_00,pcVar4,&this->Config,&local_8f0,
                        &local_970,local_a08,psVar5);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
    psVar1 = (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              *)((long)local_a00.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 0x80);
    for (p_Var6 = (((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)((long)local_a00.Backtrace.
                              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 0x80))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var6 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      local_9e8 = *(cmGeneratorTarget **)(p_Var6 + 1);
      pVar7 = std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*const&>
                        ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                          *)emitted,&local_9e8);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,&local_9e8);
      }
    }
    cmGeneratorTarget::~cmGeneratorTarget(&local_8f0);
    cmTarget::~cmTarget(&local_9f0);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_a00);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_970);
    std::
    unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
    ::~unique_ptr((unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
                   *)&local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_9d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  cmValue prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  std::unique_ptr<cmGeneratorExpressionDAGChecker> parentDagChecker;
  if (propName == "INTERFACE_LINK_OPTIONS") {
    // To please constraint checks of DAGChecker, this property must have
    // LINK_OPTIONS property as parent
    parentDagChecker = cm::make_unique<cmGeneratorExpressionDAGChecker>(
      tgt, "LINK_OPTIONS", nullptr, nullptr);
  }
  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr,
                                             parentDagChecker.get());

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile(),
                     cmTarget::PerConfig::Yes);

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     &gDummyHead, &dagChecker, tgt, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}